

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

char * parse_token(char *buf,char *buf_end,char **token,size_t *token_len,char next_char,int *ret)

{
  long lVar1;
  char *buf_start;
  size_t sVar2;
  
  if (buf != buf_end) {
    sVar2 = 0;
    do {
      if (buf[sVar2] == next_char) {
        *token = buf;
        *token_len = sVar2;
        return buf + sVar2;
      }
      if (""[(byte)buf[sVar2]] == '\0') {
        *ret = -1;
        return (char *)0x0;
      }
      lVar1 = sVar2 + 1;
      sVar2 = sVar2 + 1;
    } while (buf + lVar1 != buf_end);
  }
  *ret = -2;
  return (char *)0x0;
}

Assistant:

static const char *parse_token(const char *buf, const char *buf_end, const char **token, size_t *token_len, char next_char,
                               int *ret)
{
    /* We use pcmpestri to detect non-token characters. This instruction can take no more than eight character ranges (8*2*8=128
     * bits that is the size of a SSE register). Due to this restriction, characters `|` and `~` are handled in the slow loop. */
    static const char ALIGNED(16) ranges[] = "\x00 "  /* control chars and up to SP */
                                             "\"\""   /* 0x22 */
                                             "()"     /* 0x28,0x29 */
                                             ",,"     /* 0x2c */
                                             "//"     /* 0x2f */
                                             ":@"     /* 0x3a-0x40 */
                                             "[]"     /* 0x5b-0x5d */
                                             "{\xff"; /* 0x7b-0xff */
    const char *buf_start = buf;
    int found;
    buf = findchar_fast(buf, buf_end, ranges, sizeof(ranges) - 1, &found);
    if (!found) {
        CHECK_EOF();
    }
    while (1) {
        if (*buf == next_char) {
            break;
        } else if (!token_char_map[(unsigned char)*buf]) {
            *ret = -1;
            return NULL;
        }
        ++buf;
        CHECK_EOF();
    }
    *token = buf_start;
    *token_len = buf - buf_start;
    return buf;
}